

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

PipelineResourceDesc * __thiscall
Diligent::ShaderVariableManagerGL::GetResourceDesc(ShaderVariableManagerGL *this,Uint32 Index)

{
  PipelineResourceDesc *pPVar1;
  char (*in_RCX) [13];
  PipelineResourceSignatureType *this_00;
  string msg;
  string local_38;
  
  this_00 = (this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature
  ;
  if (this_00 == (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pSignature",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x259);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = (this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
              m_pSignature;
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                     (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                      Index);
  return pPVar1;
}

Assistant:

const PipelineResourceDesc& ShaderVariableManagerGL::GetResourceDesc(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceDesc(Index);
}